

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

void __thiscall
Js::InterpreterStackFrame::
OP_SimdInt16x8<Js::OpLayoutT_Int16x8_1Int8<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_Int16x8_1Int8<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *playout)

{
  int iVar1;
  SIMDValue bValue;
  AsmJsSIMDValue result;
  int16 values [8];
  OpLayoutT_Int16x8_1Int8<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *playout_local;
  InterpreterStackFrame *this_local;
  
  iVar1 = GetRegRawInt<unsigned_int>(this,playout->I1);
  result.field_0.i16[4] = (Type)iVar1;
  iVar1 = GetRegRawInt<unsigned_int>(this,playout->I2);
  result.field_0.i16[5] = (Type)iVar1;
  iVar1 = GetRegRawInt<unsigned_int>(this,playout->I3);
  result.field_0.i16[6] = (Type)iVar1;
  iVar1 = GetRegRawInt<unsigned_int>(this,playout->I4);
  result.field_0.i16[7] = (Type)iVar1;
  GetRegRawInt<unsigned_int>(this,playout->I5);
  GetRegRawInt<unsigned_int>(this,playout->I6);
  GetRegRawInt<unsigned_int>(this,playout->I7);
  GetRegRawInt<unsigned_int>(this,playout->I8);
  bValue = SIMDInt16x8Operation::OpInt16x8((int16 *)(result.field_0.i32 + 2));
  SetRegRawSimd<unsigned_int>(this,playout->I8_0,(AsmJsSIMDValue)bValue.field_0);
  return;
}

Assistant:

void InterpreterStackFrame::OP_SimdInt16x8(const unaligned T* playout)
    {
        int16 values[8];
        values[0] = (int16)GetRegRawInt(playout->I1);
        values[1] = (int16)GetRegRawInt(playout->I2);
        values[2] = (int16)GetRegRawInt(playout->I3);
        values[3] = (int16)GetRegRawInt(playout->I4);
        values[4] = (int16)GetRegRawInt(playout->I5);
        values[5] = (int16)GetRegRawInt(playout->I6);
        values[6] = (int16)GetRegRawInt(playout->I7);
        values[7] = (int16)GetRegRawInt(playout->I8);

        AsmJsSIMDValue result = SIMDInt16x8Operation::OpInt16x8(values);
        SetRegRawSimd(playout->I8_0, result);
    }